

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformfontdatabase.cpp
# Opt level: O2

bool operator!=(QSupportedWritingSystems *lhs,QSupportedWritingSystems *rhs)

{
  bool *pbVar1;
  bool *pbVar2;
  bool bVar3;
  long lVar4;
  
  if (lhs->d == rhs->d) {
    return false;
  }
  lVar4 = 0;
  do {
    bVar3 = lVar4 != 0x22;
    if (lVar4 == 0x22) {
      return bVar3;
    }
    pbVar1 = (lhs->d->list).d.ptr + lVar4;
    pbVar2 = (rhs->d->list).d.ptr + lVar4;
    lVar4 = lVar4 + 1;
  } while (*pbVar1 == *pbVar2);
  return bVar3;
}

Assistant:

bool operator!=(const QSupportedWritingSystems &lhs, const QSupportedWritingSystems &rhs)
{
    if (lhs.d == rhs.d)
        return false;

    Q_ASSERT(lhs.d->list.size() == rhs.d->list.size());
    Q_ASSERT(lhs.d->list.size() == QFontDatabase::WritingSystemsCount);
    for (int i = 0; i < QFontDatabase::WritingSystemsCount; ++i) {
        if (lhs.d->list.at(i) != rhs.d->list.at(i))
            return true;
    }

    return false;
}